

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopBalance.c
# Opt level: O1

Hop_Obj_t *
Hop_NodeBalanceBuildSuper(Hop_Man_t *p,Vec_Ptr_t *vSuper,Hop_Type_t Type,int fUpdateLevel)

{
  uint uVar1;
  Hop_Obj_t *pHVar2;
  Hop_Obj_t *pHVar3;
  void *pvVar4;
  bool bVar5;
  Hop_Obj_t *pHVar6;
  uint uVar7;
  Hop_Obj_t *pHVar8;
  Hop_Obj_t *pHVar9;
  void **ppvVar10;
  Hop_Obj_t *pHVar11;
  long lVar12;
  Hop_Obj_t *pHVar13;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  
  if ((long)vSuper->nSize < 2) {
    __assert_fail("vSuper->nSize > 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/hop/hopBalance.c"
                  ,0xf7,
                  "Hop_Obj_t *Hop_NodeBalanceBuildSuper(Hop_Man_t *, Vec_Ptr_t *, Hop_Type_t, int)")
    ;
  }
  qsort(vSuper->pArray,(long)vSuper->nSize,8,Hop_NodeCompareLevelsDecrease);
  uVar7 = vSuper->nSize;
  if (1 < (int)uVar7) {
    do {
      uVar14 = 0;
      if (uVar7 != 2 && fUpdateLevel != 0) {
        ppvVar10 = vSuper->pArray;
        uVar1 = *(uint *)(((ulong)ppvVar10[(ulong)uVar7 - 2] & 0xfffffffffffffffe) + 0x20);
        uVar15 = (ulong)(uVar7 - 3);
        do {
          if (0x3f < (*(uint *)(((ulong)ppvVar10[uVar15] & 0xfffffffffffffffe) + 0x20) ^ uVar1))
          goto LAB_007aafde;
          bVar5 = 0 < (long)uVar15;
          uVar15 = uVar15 - 1;
        } while (bVar5);
        uVar15 = 0xffffffff;
LAB_007aafde:
        if (((int)uVar15 < -1) || (uVar14 = (int)uVar15 + 1, (int)uVar7 <= (int)uVar14))
        goto LAB_007ab2c9;
        if (0x3f < (uVar1 ^ *(uint *)(((ulong)ppvVar10[uVar14] & 0xfffffffffffffffe) + 0x20))) {
          __assert_fail("Hop_ObjLevel(Hop_Regular(pObjLeft)) == Hop_ObjLevel(Hop_Regular(pObjRight))"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/hop/hopBalance.c"
                        ,0x12e,"int Hop_NodeBalanceFindLeft(Vec_Ptr_t *)");
        }
      }
      uVar1 = uVar7 - 2;
      if ((int)uVar1 < (int)uVar14) {
        __assert_fail("LeftBound <= RightBound",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/hop/hopBalance.c"
                      ,0x144,"void Hop_NodeBalancePermute(Hop_Man_t *, Vec_Ptr_t *, int, int)");
      }
      if (uVar1 != uVar14) {
        pHVar9 = (Hop_Obj_t *)vSuper->pArray[(ulong)uVar7 - 1];
        pHVar13 = (Hop_Obj_t *)((ulong)pHVar9 & 0xfffffffffffffffe);
        if (p->pConst1 != pHVar13) {
          pHVar2 = (Hop_Obj_t *)vSuper->pArray[uVar1];
          uVar7 = uVar1;
          if (p->pConst1 != (Hop_Obj_t *)((ulong)pHVar2 & 0xfffffffffffffffe)) {
            do {
              if (((int)uVar7 < 0) || (iVar16 = vSuper->nSize, iVar16 <= (int)uVar7))
              goto LAB_007ab2c9;
              pHVar3 = (Hop_Obj_t *)vSuper->pArray[uVar7];
              pHVar8 = (Hop_Obj_t *)((ulong)pHVar3 & 0xfffffffffffffffe);
              if (p->pConst1 == pHVar8) {
                vSuper->pArray[uVar7] = pHVar2;
joined_r0x007ab131:
                if (iVar16 <= (int)uVar1) {
LAB_007ab3a2:
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                                ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
                }
                vSuper->pArray[uVar1] = pHVar3;
                break;
              }
              if ((Type != AIG_EXOR) && ((*(uint *)&pHVar13->field_0x20 & 7) == 1)) {
                __assert_fail("Type != AIG_AND || !Hop_ObjIsConst1(Hop_Regular(p0))",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/hop/hop.h"
                              ,0xd3,
                              "Hop_Obj_t *Hop_ObjCreateGhost(Hop_Man_t *, Hop_Obj_t *, Hop_Obj_t *, Hop_Type_t)"
                             );
              }
              if ((pHVar3 != (Hop_Obj_t *)0x0) && ((*(uint *)&pHVar8->field_0x20 & 7) == 1)) {
                __assert_fail("p1 == NULL || !Hop_ObjIsConst1(Hop_Regular(p1))",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/hop/hop.h"
                              ,0xd4,
                              "Hop_Obj_t *Hop_ObjCreateGhost(Hop_Man_t *, Hop_Obj_t *, Hop_Obj_t *, Hop_Type_t)"
                             );
              }
              if (pHVar13 == pHVar8) {
                __assert_fail("Type == AIG_PI || Hop_Regular(p0) != Hop_Regular(p1)",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/hop/hop.h"
                              ,0xd5,
                              "Hop_Obj_t *Hop_ObjCreateGhost(Hop_Man_t *, Hop_Obj_t *, Hop_Obj_t *, Hop_Type_t)"
                             );
              }
              *(uint *)&(p->Ghost).field_0x20 =
                   (*(uint *)&(p->Ghost).field_0x20 & 0xfffffff8) + (Type == AIG_EXOR | 4);
              pHVar11 = pHVar9;
              pHVar6 = pHVar3;
              if (pHVar13->Id < pHVar8->Id) {
                pHVar11 = pHVar3;
                pHVar6 = pHVar9;
              }
              (p->Ghost).pFanin0 = pHVar6;
              (p->Ghost).pFanin1 = pHVar11;
              pHVar8 = Hop_TableLookup(p,&p->Ghost);
              if (pHVar8 != (Hop_Obj_t *)0x0) {
                if (pHVar3 != pHVar2) {
                  iVar16 = vSuper->nSize;
                  if (iVar16 <= (int)uVar7) goto LAB_007ab3a2;
                  vSuper->pArray[uVar7] = pHVar2;
                  goto joined_r0x007ab131;
                }
                break;
              }
              bVar5 = (int)uVar14 < (int)uVar7;
              uVar7 = uVar7 - 1;
            } while (bVar5);
          }
        }
      }
      iVar16 = vSuper->nSize;
      if (iVar16 < 1) {
LAB_007ab307:
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x2cc,"void *Vec_PtrPop(Vec_Ptr_t *)");
      }
      vSuper->nSize = iVar16 - 1U;
      if (iVar16 == 1) goto LAB_007ab307;
      pHVar9 = (Hop_Obj_t *)vSuper->pArray[iVar16 - 1U];
      vSuper->nSize = iVar16 - 2U;
      pHVar9 = Hop_Oper(p,pHVar9,(Hop_Obj_t *)vSuper->pArray[iVar16 - 2U],Type);
      uVar7 = vSuper->nSize;
      if (0 < (long)(int)uVar7) {
        lVar12 = 0;
        do {
          if ((Hop_Obj_t *)vSuper->pArray[lVar12] == pHVar9) goto LAB_007ab293;
          lVar12 = lVar12 + 1;
        } while ((int)uVar7 != lVar12);
      }
      uVar14 = vSuper->nCap;
      if (uVar7 == uVar14) {
        if ((int)uVar14 < 0x10) {
          if (vSuper->pArray == (void **)0x0) {
            ppvVar10 = (void **)malloc(0x80);
          }
          else {
            ppvVar10 = (void **)realloc(vSuper->pArray,0x80);
          }
          iVar16 = 0x10;
        }
        else {
          iVar16 = uVar14 * 2;
          if (iVar16 <= (int)uVar14) goto LAB_007ab22e;
          if (vSuper->pArray == (void **)0x0) {
            ppvVar10 = (void **)malloc((ulong)uVar14 << 4);
          }
          else {
            ppvVar10 = (void **)realloc(vSuper->pArray,(ulong)uVar14 << 4);
          }
        }
        vSuper->pArray = ppvVar10;
        vSuper->nCap = iVar16;
      }
LAB_007ab22e:
      uVar15 = (ulong)vSuper->nSize;
      uVar7 = vSuper->nSize + 1;
      vSuper->nSize = uVar7;
      vSuper->pArray[uVar15] = pHVar9;
      if (0 < (long)uVar15) {
        lVar12 = (ulong)uVar7 - 2;
        do {
          ppvVar10 = vSuper->pArray;
          pvVar4 = ppvVar10[uVar15 & 0xffffffff];
          if (*(uint *)(((ulong)pvVar4 & 0xfffffffffffffffe) + 0x20) >> 6 <=
              *(uint *)(((ulong)ppvVar10[lVar12] & 0xfffffffffffffffe) + 0x20) >> 6) break;
          ppvVar10[uVar15 & 0xffffffff] = ppvVar10[lVar12];
          vSuper->pArray[lVar12] = pvVar4;
          iVar16 = (int)uVar15;
          uVar15 = (ulong)(iVar16 - 1);
          lVar12 = lVar12 + -1;
        } while (1 < iVar16);
      }
LAB_007ab293:
      uVar7 = vSuper->nSize;
    } while (1 < (int)uVar7);
  }
  if (uVar7 == 1) {
    return (Hop_Obj_t *)*vSuper->pArray;
  }
LAB_007ab2c9:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Hop_Obj_t * Hop_NodeBalanceBuildSuper( Hop_Man_t * p, Vec_Ptr_t * vSuper, Hop_Type_t Type, int fUpdateLevel )
{
    Hop_Obj_t * pObj1, * pObj2;
    int LeftBound;
    assert( vSuper->nSize > 1 );
    // sort the new nodes by level in the decreasing order
    Vec_PtrSort( vSuper, (int (*)(void))Hop_NodeCompareLevelsDecrease );
    // balance the nodes
    while ( vSuper->nSize > 1 )
    {
        // find the left bound on the node to be paired
        LeftBound = (!fUpdateLevel)? 0 : Hop_NodeBalanceFindLeft( vSuper );
        // find the node that can be shared (if no such node, randomize choice)
        Hop_NodeBalancePermute( p, vSuper, LeftBound, Type == AIG_EXOR );
        // pull out the last two nodes
        pObj1 = (Hop_Obj_t *)Vec_PtrPop(vSuper);
        pObj2 = (Hop_Obj_t *)Vec_PtrPop(vSuper);
        Hop_NodeBalancePushUniqueOrderByLevel( vSuper, Hop_Oper(p, pObj1, pObj2, Type) );
    }
    return (Hop_Obj_t *)Vec_PtrEntry(vSuper, 0);
}